

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

void __thiscall libDAI::TRW::TRW(TRW *this,FactorGraph *fg,Properties *opts)

{
  _Rb_tree_header *p_Var1;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *this_00;
  _Rb_tree_header *p_Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  Exception *this_01;
  long lVar7;
  ulong uVar8;
  allocator<char> local_59;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *local_58;
  string local_50;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  p_Var1 = &(this->_rho_e).
            super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  this_00 = &this->_messages;
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f778;
  this->_iterations = 0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).outertol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).maxouteriter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  this->_maxdiff = 0.0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->_rho_e_descent).
            super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined1 (*) [32])
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = ZEXT432(0) << 0x40;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar4 = initProps(this);
  if (bVar4) {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::clear(this_00);
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
              (this_00,*(long *)(CONCAT44(extraout_var,iVar5) + 0x48) -
                       *(long *)(CONCAT44(extraout_var,iVar5) + 0x40) >> 4);
    lVar7 = 0;
    uVar8 = 0;
    local_58 = &this->_newmessages;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x40) >> 4) <= uVar8) break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar3 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x40) + lVar7);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x30))
                        ((long *)CONCAT44(extraout_var_02,iVar5),uVar3);
      TProb<double>::TProb((TProb<double> *)&local_50,*(size_t *)(lVar6 + 8));
      std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
      emplace_back<libDAI::TProb<double>>
                ((vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)this_00,
                 (TProb<double> *)&local_50);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_50);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    }
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
              (local_58,this_00);
    init_rho_e(this);
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"trw.cpp, line 74",&local_59);
  Exception::Exception(this_01,8,&local_50);
  __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TRW::TRW(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _messages(), _newmessages(), _rho_e(), _rho_e_descent() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // create messages
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            _messages.push_back( Prob( grm().var(i).states() ) );
        }

        // create new_messages
        _newmessages = _messages;

        // create valid initial rho_e
        init_rho_e();
    }